

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

int POOL_tryAdd(POOL_ctx *ctx,POOL_function function,void *opaque)

{
  int iVar1;
  void *opaque_local;
  POOL_function function_local;
  POOL_ctx *ctx_local;
  
  if (ctx != (POOL_ctx *)0x0) {
    pthread_mutex_lock((pthread_mutex_t *)&ctx->queueMutex);
    iVar1 = isQueueFull(ctx);
    if (iVar1 == 0) {
      POOL_add_internal(ctx,function,opaque);
      pthread_mutex_unlock((pthread_mutex_t *)&ctx->queueMutex);
    }
    else {
      pthread_mutex_unlock((pthread_mutex_t *)&ctx->queueMutex);
    }
    ctx_local._4_4_ = (uint)(iVar1 == 0);
    return ctx_local._4_4_;
  }
  __assert_fail("ctx != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                ,0x1457,"int POOL_tryAdd(POOL_ctx *, POOL_function, void *)");
}

Assistant:

int POOL_tryAdd(POOL_ctx* ctx, POOL_function function, void* opaque)
{
    assert(ctx != NULL);
    ZSTD_pthread_mutex_lock(&ctx->queueMutex);
    if (isQueueFull(ctx)) {
        ZSTD_pthread_mutex_unlock(&ctx->queueMutex);
        return 0;
    }
    POOL_add_internal(ctx, function, opaque);
    ZSTD_pthread_mutex_unlock(&ctx->queueMutex);
    return 1;
}